

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O3

bool __thiscall Builder::StartEdge(Builder *this,Edge *edge,string *err)

{
  CommandRunner *pCVar1;
  Metrics *this_00;
  bool bVar2;
  char cVar3;
  int iVar4;
  int64_t iVar5;
  long *plVar6;
  Metric *pMVar7;
  size_type *psVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  bool bVar10;
  size_type sVar11;
  pointer ppNVar12;
  string rspfile;
  string content;
  ScopedMetric metrics_h_scoped;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  ScopedMetric local_40;
  
  if (StartEdge(Edge*,std::__cxx11::string*)::metrics_h_metric == '\0') {
    iVar4 = __cxa_guard_acquire(&StartEdge(Edge*,std::__cxx11::string*)::metrics_h_metric);
    this_00 = g_metrics;
    if (iVar4 != 0) {
      if (g_metrics == (Metrics *)0x0) {
        pMVar7 = (Metric *)0x0;
      }
      else {
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"StartEdge","");
        pMVar7 = Metrics::NewMetric(this_00,&local_a0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
      }
      StartEdge::metrics_h_metric = pMVar7;
      __cxa_guard_release(&StartEdge(Edge*,std::__cxx11::string*)::metrics_h_metric);
    }
  }
  ScopedMetric::ScopedMetric(&local_40,StartEdge::metrics_h_metric);
  bVar2 = Edge::is_phony(edge);
  bVar10 = true;
  if (bVar2) goto LAB_0010a951;
  iVar5 = GetTimeMillis();
  sVar11 = iVar5 - this->start_time_millis_;
  local_a0._M_dataplus._M_p = (pointer)edge;
  local_a0._M_string_length = sVar11;
  std::
  _Rb_tree<Edge_const*,std::pair<Edge_const*const,int>,std::_Select1st<std::pair<Edge_const*const,int>>,std::less<Edge_const*>,std::allocator<std::pair<Edge_const*const,int>>>
  ::_M_emplace_unique<std::pair<Edge*,long>>
            ((_Rb_tree<Edge_const*,std::pair<Edge_const*const,int>,std::_Select1st<std::pair<Edge_const*const,int>>,std::less<Edge_const*>,std::allocator<std::pair<Edge_const*const,int>>>
              *)&this->running_edges_,(pair<Edge_*,_long> *)&local_a0);
  (*this->status_->_vptr_Status[1])(this->status_,edge,sVar11);
  for (ppNVar12 = (edge->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
      ppNVar12 !=
      (edge->outputs_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppNVar12 = ppNVar12 + 1) {
    bVar2 = DiskInterface::MakeDirs(this->disk_interface_,&(*ppNVar12)->path_);
    if (!bVar2) {
      bVar10 = false;
      goto LAB_0010a951;
    }
  }
  Edge::GetUnescapedRspfile_abi_cxx11_(&local_a0,edge);
  if (local_a0._M_string_length == 0) {
LAB_0010a7f4:
    pCVar1 = (this->command_runner_)._M_t.
             super___uniq_ptr_impl<CommandRunner,_std::default_delete<CommandRunner>_>._M_t.
             super__Tuple_impl<0UL,_CommandRunner_*,_std::default_delete<CommandRunner>_>.
             super__Head_base<0UL,_CommandRunner_*,_false>._M_head_impl;
    iVar4 = (*pCVar1->_vptr_CommandRunner[4])(pCVar1,edge);
    bVar10 = true;
    if ((char)iVar4 == '\0') {
      Edge::EvaluateCommand_abi_cxx11_(&local_60,edge,false);
      plVar6 = (long *)std::__cxx11::string::replace((ulong)&local_60,0,(char *)0x0,0x126661);
      psVar8 = (size_type *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar8) {
        local_c0.field_2._M_allocated_capacity = *psVar8;
        local_c0.field_2._8_8_ = plVar6[3];
        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      }
      else {
        local_c0.field_2._M_allocated_capacity = *psVar8;
        local_c0._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_c0._M_string_length = plVar6[1];
      *plVar6 = (long)psVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      plVar6 = (long *)std::__cxx11::string::append((char *)&local_c0);
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(plVar6 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar6 == paVar9) {
        local_80.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_80.field_2._8_8_ = plVar6[3];
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      }
      else {
        local_80.field_2._M_allocated_capacity = paVar9->_M_allocated_capacity;
        local_80._M_dataplus._M_p = (pointer)*plVar6;
      }
      local_80._M_string_length = plVar6[1];
      *plVar6 = (long)paVar9;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
      std::__cxx11::string::operator=((string *)err,(string *)&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
      goto LAB_0010a934;
    }
  }
  else {
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"rspfile_content","");
    Edge::GetBinding(&local_80,edge,&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    cVar3 = (**(code **)(*(long *)this->disk_interface_ + 0x28))
                      (this->disk_interface_,&local_a0,&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p != &local_80.field_2) {
      operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
    }
    if (cVar3 != '\0') goto LAB_0010a7f4;
LAB_0010a934:
    bVar10 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
LAB_0010a951:
  ScopedMetric::~ScopedMetric(&local_40);
  return bVar10;
}

Assistant:

bool Builder::StartEdge(Edge* edge, string* err) {
  METRIC_RECORD("StartEdge");
  if (edge->is_phony())
    return true;

  int64_t start_time_millis = GetTimeMillis() - start_time_millis_;
  running_edges_.insert(make_pair(edge, start_time_millis));

  status_->BuildEdgeStarted(edge, start_time_millis);

  // Create directories necessary for outputs.
  // XXX: this will block; do we care?
  for (vector<Node*>::iterator o = edge->outputs_.begin();
       o != edge->outputs_.end(); ++o) {
    if (!disk_interface_->MakeDirs((*o)->path()))
      return false;
  }

  // Create response file, if needed
  // XXX: this may also block; do we care?
  string rspfile = edge->GetUnescapedRspfile();
  if (!rspfile.empty()) {
    string content = edge->GetBinding("rspfile_content");
    if (!disk_interface_->WriteFile(rspfile, content))
      return false;
  }

  // start command computing and run it
  if (!command_runner_->StartCommand(edge)) {
    err->assign("command '" + edge->EvaluateCommand() + "' failed.");
    return false;
  }

  return true;
}